

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O0

void anon_unknown.dwarf_57ca7::createNegativeYEdge<float>
               (vector<float,_std::allocator<float>_> *data,
               vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *point,float x,
               float y)

{
  bool bVar1;
  reference pfVar2;
  float in_XMM0_Da;
  float in_XMM1_Da;
  const_iterator dataY;
  value_type *in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  PointBase2D<float> local_30;
  float *local_28;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_20;
  float local_18;
  float local_14;
  
  local_18 = in_XMM1_Da;
  local_14 = in_XMM0_Da;
  local_20._M_current =
       (float *)std::vector<float,_std::allocator<float>_>::cbegin
                          ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffffb8);
  while( true ) {
    local_28 = (float *)std::vector<float,_std::allocator<float>_>::cend
                                  ((vector<float,_std::allocator<float>_> *)
                                   in_stack_ffffffffffffffb8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    in_stack_ffffffffffffffc0 = local_18;
    in_stack_ffffffffffffffc4 = local_14;
    pfVar2 = __gnu_cxx::
             __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_20);
    PointBase2D<float>::PointBase2D
              (&local_30,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0 - *pfVar2);
    std::vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>::push_back
              ((vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    __gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
    operator++(&local_20);
  }
  return;
}

Assistant:

void createNegativeYEdge( const std::vector< _Type > & data, std::vector < PointBase2D<_Type> > & point, _Type x, _Type y )
    {
        for ( typename std::vector < _Type >::const_iterator dataY = data.cbegin(); dataY != data.cend(); ++dataY )
            point.push_back( PointBase2D<_Type>( x, y - (*dataY) ) );
    }